

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall
WordSplitSVTest_single_word_Test<wchar_t>::TestBody(WordSplitSVTest_single_word_Test<wchar_t> *this)

{
  char *pcVar1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar2;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  split_result;
  int local_40 [2];
  long *local_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  container_type_conflict2 local_20;
  
  bVar2 = make_word_view<wchar_t>(8,L'\0');
  jessilib::word_split<std::vector,_const_wchar_t_*,_const_wchar_t_*,_wchar_t>
            (&local_20,bVar2._M_str,bVar2._M_str + bVar2._M_len,L'\0');
  local_38 = (long *)((long)local_20.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_20.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_40[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_30,"split_result.size()","1",(unsigned_long *)&local_38,local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x46,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_40);
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_38 = (long *)(local_20.
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  local_40[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_30,"split_result[0].size()","8",(unsigned_long *)&local_38,local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x47,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_40);
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_20);
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, single_word) {
	std::basic_string_view<TypeParam> single_word = make_word_view<TypeParam>();
	std::vector<std::basic_string<TypeParam>> split_result = word_split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}